

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

double __thiscall ADynamicLight::DistToSeg(ADynamicLight *this,DVector3 *pos,seg_t *seg)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double seg_length_sq;
  double seg_dy;
  double seg_dx;
  double py;
  double px;
  double u;
  seg_t *seg_local;
  DVector3 *pos_local;
  ADynamicLight *this_local;
  
  dVar1 = vertex_t::fX(seg->v2);
  dVar2 = vertex_t::fX(seg->v1);
  dVar1 = dVar1 - dVar2;
  dVar3 = vertex_t::fY(seg->v2);
  dVar2 = vertex_t::fY(seg->v1);
  dVar3 = dVar3 - dVar2;
  dVar2 = pos->X;
  dVar4 = vertex_t::fX(seg->v1);
  dVar6 = pos->Y;
  dVar5 = vertex_t::fY(seg->v1);
  px = ((dVar2 - dVar4) * dVar1 + (dVar6 - dVar5) * dVar3) / (dVar1 * dVar1 + dVar3 * dVar3);
  if (0.0 <= px) {
    if (1.0 < px) {
      px = 1.0;
    }
  }
  else {
    px = 0.0;
  }
  dVar2 = vertex_t::fX(seg->v1);
  dVar6 = vertex_t::fY(seg->v1);
  dVar2 = (dVar2 + px * dVar1) - pos->X;
  dVar6 = (dVar6 + px * dVar3) - pos->Y;
  return dVar2 * dVar2 + dVar6 * dVar6;
}

Assistant:

double ADynamicLight::DistToSeg(const DVector3 &pos, seg_t *seg)
{
	double u, px, py;

	double seg_dx = seg->v2->fX() - seg->v1->fX();
	double seg_dy = seg->v2->fY() - seg->v1->fY();
	double seg_length_sq = seg_dx * seg_dx + seg_dy * seg_dy;

	u = (((pos.X - seg->v1->fX()) * seg_dx) + (pos.Y - seg->v1->fY()) * seg_dy) / seg_length_sq;
	if (u < 0.) u = 0.; // clamp the test point to the line segment
	else if (u > 1.) u = 1.;

	px = seg->v1->fX() + (u * seg_dx);
	py = seg->v1->fY() + (u * seg_dy);

	px -= pos.X;
	py -= pos.Y;

	return (px*px) + (py*py);
}